

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeStringEq<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          StringEqOp op)

{
  allocator<char> local_61;
  string local_60;
  Err local_40;
  StringEqOp local_20;
  Index local_1c;
  StringEqOp op_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  local_20 = op;
  local_1c = pos;
  _op_local = ctx;
  ctx_local = (ParseDeclsCtx *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"unimplemented instruction",&local_61);
  ParseInput::err(&local_40,&ctx->in,&local_60);
  Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_40);
  WATParser::Err::~Err(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeStringEq(Ctx& ctx, Index pos, StringEqOp op) {
  return ctx.in.err("unimplemented instruction");
}